

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  uint uVar2;
  attributeDeclSAXFunc p_Var3;
  xmlEntityPtr pxVar4;
  xmlParserErrors error;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  xmlParserInputPtr pxVar11;
  void *pvVar12;
  xmlHashTablePtr pxVar13;
  xmlChar *pxVar14;
  int *payload;
  size_t sVar15;
  long lVar16;
  xmlChar *pxVar17;
  xmlChar xVar18;
  char *msg;
  xmlHashedString xVar19;
  int local_74;
  xmlChar *local_70;
  xmlChar *defaultValue;
  xmlChar *local_60;
  xmlEnumerationPtr tree;
  uint local_4c;
  int *local_48;
  xmlChar *local_40;
  uint local_38;
  int local_34;
  
  pxVar11 = ctxt->input;
  pxVar9 = pxVar11->cur;
  if ((*pxVar9 == '<') && (pxVar9[1] == '!')) {
    pxVar10 = pxVar9 + 2;
    pxVar11->cur = pxVar10;
    pxVar11->col = pxVar11->col + 2;
    xVar18 = pxVar9[2];
    if (xVar18 == '\0') {
      xmlParserGrow(ctxt);
      pxVar11 = ctxt->input;
      pxVar10 = pxVar11->cur;
      xVar18 = *pxVar10;
    }
    if (((((xVar18 == 'A') && (pxVar10[1] == 'T')) && (pxVar10[2] == 'T')) &&
        ((pxVar10[3] == 'L' && (pxVar10[4] == 'I')))) &&
       ((pxVar10[5] == 'S' && (pxVar10[6] == 'T')))) {
      local_34 = pxVar11->id;
      pxVar11->cur = pxVar10 + 7;
      pxVar11->col = pxVar11->col + 7;
      if (pxVar10[7] == '\0') {
        xmlParserGrow(ctxt);
      }
      iVar5 = xmlSkipBlankCharsPE(ctxt);
      if (iVar5 == 0) {
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'<!ATTLIST\'\n");
      }
      pxVar9 = xmlParseName(ctxt);
      if (pxVar9 == (xmlChar *)0x0) {
        xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"ATTLIST: no name for Element\n");
        return;
      }
      xmlSkipBlankCharsPE(ctxt);
      pxVar11 = ctxt->input;
      local_40 = pxVar9;
      if (((pxVar11->flags & 0x40) == 0) && ((long)pxVar11->end - (long)pxVar11->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      while( true ) {
        pxVar11 = ctxt->input;
        if (*pxVar11->cur == '>') break;
        if (1 < ctxt->disableSAX) {
          return;
        }
        defaultValue = (xmlChar *)0x0;
        if (((pxVar11->flags & 0x40) == 0) && ((long)pxVar11->end - (long)pxVar11->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
        tree = (xmlEnumerationPtr)0x0;
        pxVar10 = xmlParseName(ctxt);
        if (pxVar10 == (xmlChar *)0x0) {
          msg = "ATTLIST: no name for Attribute\n";
          error = XML_ERR_NAME_REQUIRED;
LAB_0013851e:
          xmlFatalErrMsg(ctxt,error,msg);
LAB_00138571:
          pxVar11 = ctxt->input;
          if (*pxVar11->cur != '>') {
            return;
          }
          break;
        }
        pxVar11 = ctxt->input;
        if (((pxVar11->flags & 0x40) == 0) && ((long)pxVar11->end - (long)pxVar11->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
        iVar5 = xmlSkipBlankCharsPE(ctxt);
        if (iVar5 == 0) {
          msg = "Space required after the attribute name\n";
          error = XML_ERR_SPACE_REQUIRED;
          goto LAB_0013851e;
        }
        uVar6 = xmlParseAttributeType(ctxt,&tree);
        if ((int)uVar6 < 1) goto LAB_00138571;
        pxVar11 = ctxt->input;
        if (((pxVar11->flags & 0x40) == 0) && ((long)pxVar11->end - (long)pxVar11->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
        iVar5 = xmlSkipBlankCharsPE(ctxt);
        if (iVar5 == 0) {
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after the attribute type\n");
LAB_00138562:
          if (tree != (xmlEnumerationPtr)0x0) {
            xmlFreeEnumeration(tree);
          }
          goto LAB_00138571;
        }
        iVar5 = xmlParseDefaultDecl(ctxt,&defaultValue);
        if (defaultValue != (xmlChar *)0x0 && uVar6 != 1) {
          pxVar17 = defaultValue + -1;
          do {
            xVar18 = pxVar17[1];
            pxVar17 = pxVar17 + 1;
            pxVar14 = defaultValue;
          } while (xVar18 == ' ');
LAB_001380b4:
          if (xVar18 == ' ') goto LAB_0013809f;
          if (xVar18 != '\0') {
            pxVar17 = pxVar17 + 1;
            goto LAB_001380ad;
          }
          *pxVar14 = '\0';
        }
        pxVar11 = ctxt->input;
        if (((pxVar11->flags & 0x40) == 0) && ((long)pxVar11->end - (long)pxVar11->cur < 0xfa)) {
          xmlParserGrow(ctxt);
          pxVar11 = ctxt->input;
        }
        if ((*pxVar11->cur != '>') && (iVar7 = xmlSkipBlankCharsPE(ctxt), iVar7 == 0)) {
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,
                         "Space required after the attribute default value\n");
          if (defaultValue != (xmlChar *)0x0) {
            (*xmlFree)(defaultValue);
          }
          goto LAB_00138562;
        }
        if (((ctxt->sax == (_xmlSAXHandler *)0x0) || (ctxt->disableSAX != 0)) ||
           (p_Var3 = ctxt->sax->attributeDecl, p_Var3 == (attributeDeclSAXFunc)0x0)) {
          if (tree != (xmlEnumerationPtr)0x0) {
            xmlFreeEnumeration(tree);
          }
        }
        else {
          (*p_Var3)(ctxt->userData,pxVar9,pxVar10,uVar6,iVar5,defaultValue,tree);
        }
        pxVar17 = defaultValue;
        iVar7 = ctxt->sax2;
        if (iVar5 - 4U < 0xfffffffe && (defaultValue != (xmlChar *)0x0 && iVar7 != 0)) {
          if ((ctxt->attsSpecial == (xmlHashTablePtr)0x0) ||
             (pvVar12 = xmlHashLookup2(ctxt->attsSpecial,pxVar9,pxVar10), pvVar12 == (void *)0x0)) {
            if (ctxt->attsDefault == (xmlHashTablePtr)0x0) {
              pxVar13 = xmlHashCreateDict(10,ctxt->dict);
              ctxt->attsDefault = pxVar13;
              if (pxVar13 != (xmlHashTablePtr)0x0) goto LAB_001381c4;
            }
            else {
LAB_001381c4:
              pxVar9 = local_40;
              pxVar14 = xmlSplitQName3(local_40,&local_74);
              if (pxVar14 == (xmlChar *)0x0) {
                xVar19 = xmlDictLookupHashed(ctxt->dict,pxVar9,-1);
                pxVar14 = xVar19.name;
                if (pxVar14 != (xmlChar *)0x0) {
                  pxVar9 = (xmlChar *)0x0;
                  goto LAB_00138235;
                }
              }
              else {
                xVar19 = xmlDictLookupHashed(ctxt->dict,pxVar14,-1);
                pxVar14 = xVar19.name;
                xVar19 = xmlDictLookupHashed(ctxt->dict,pxVar9,local_74);
                pxVar9 = xVar19.name;
                local_4c = xVar19.hashValue;
                if (pxVar14 != (xmlChar *)0x0 && pxVar9 != (xmlChar *)0x0) {
LAB_00138235:
                  local_70 = pxVar9;
                  payload = (int *)xmlHashLookup2(ctxt->attsDefault,pxVar14,pxVar9);
                  uVar8 = 4;
                  if (payload == (int *)0x0) {
LAB_00138280:
                    local_60 = (xmlChar *)CONCAT44(local_60._4_4_,uVar8);
                    local_48 = payload;
                    payload = (int *)(*xmlRealloc)(payload,(ulong)uVar8 << 6 | 8);
                    if (payload != (int *)0x0) {
                      if (local_48 == (int *)0x0) {
                        *payload = 0;
                      }
                      payload[1] = (int)local_60;
                      iVar5 = xmlHashUpdateEntry2(ctxt->attsDefault,pxVar14,local_70,payload,
                                                  (xmlHashDeallocator)0x0);
                      if (-1 < iVar5) goto LAB_001382e6;
                      (*xmlFree)(payload);
                    }
                  }
                  else {
                    uVar2 = payload[1];
                    if ((int)uVar2 <= *payload) {
                      if (99999999 < uVar2) goto LAB_0013844d;
                      uVar8 = uVar2 * 2;
                      if (50000000 < uVar2) {
                        uVar8 = 100000000;
                      }
                      goto LAB_00138280;
                    }
LAB_001382e6:
                    local_48 = payload;
                    pxVar9 = xmlSplitQName3(pxVar10,&local_74);
                    if (pxVar9 == (xmlChar *)0x0) {
                      xVar19 = xmlDictLookupHashed(ctxt->dict,pxVar10,-1);
                      local_60 = xVar19.name;
                      if (local_60 != (xmlChar *)0x0) {
                        uVar8 = xVar19.hashValue;
                        local_70 = (xmlChar *)0x0;
                        goto LAB_0013836b;
                      }
                    }
                    else {
                      xVar19 = xmlDictLookupHashed(ctxt->dict,pxVar9,-1);
                      pxVar9 = xVar19.name;
                      uVar8 = xVar19.hashValue;
                      xVar19 = xmlDictLookupHashed(ctxt->dict,pxVar10,local_74);
                      local_70 = xVar19.name;
                      local_4c = xVar19.hashValue;
                      local_60 = pxVar9;
                      if (pxVar9 != (xmlChar *)0x0 && local_70 != (xmlChar *)0x0) {
LAB_0013836b:
                        sVar15 = strlen((char *)pxVar17);
                        local_74 = (int)sVar15;
                        xVar19 = xmlDictLookupHashed(ctxt->dict,pxVar17,local_74);
                        pxVar9 = xVar19.name;
                        if (pxVar9 != (xmlChar *)0x0) {
                          local_38 = uVar8;
                          sVar15 = strlen((char *)local_60);
                          iVar5 = (int)sVar15;
                          if (local_70 != (xmlChar *)0x0) {
                            sVar15 = strlen((char *)local_70);
                            iVar5 = iVar5 + (int)sVar15;
                          }
                          lVar16 = (long)*local_48;
                          uVar8 = 1;
                          *local_48 = *local_48 + 1;
                          local_48[lVar16 * 0x10 + 6] = local_38;
                          *(xmlChar **)(local_48 + lVar16 * 0x10 + 8) = local_60;
                          local_48[lVar16 * 0x10 + 2] = local_4c;
                          *(xmlChar **)(local_48 + lVar16 * 0x10 + 4) = local_70;
                          local_48[lVar16 * 0x10 + 10] = xVar19.hashValue;
                          *(xmlChar **)(local_48 + lVar16 * 0x10 + 0xc) = pxVar9;
                          *(xmlChar **)(local_48 + lVar16 * 0x10 + 0xe) = pxVar9 + local_74;
                          if (ctxt->inSubset != 2) {
                            pxVar4 = ctxt->input->entity;
                            uVar8 = 0;
                            if (pxVar4 != (xmlEntityPtr)0x0) {
                              uVar8 = (uint)(pxVar4->etype == XML_EXTERNAL_PARAMETER_ENTITY);
                            }
                          }
                          local_48[lVar16 * 0x10 + 0x10] = uVar8;
                          local_48[lVar16 * 0x10 + 0x11] = iVar5 + local_74;
                          pxVar9 = local_40;
                          goto LAB_0013845a;
                        }
                      }
                    }
                  }
                }
              }
            }
LAB_0013844d:
            xmlCtxtErrMemory(ctxt);
            pxVar9 = local_40;
          }
LAB_0013845a:
          iVar7 = ctxt->sax2;
        }
        if (iVar7 != 0) {
          pxVar13 = ctxt->attsSpecial;
          if (pxVar13 == (xmlHashTablePtr)0x0) {
            pxVar13 = xmlHashCreateDict(10,ctxt->dict);
            ctxt->attsSpecial = pxVar13;
            if (pxVar13 != (xmlHashTablePtr)0x0) goto LAB_0013848e;
          }
          else {
LAB_0013848e:
            iVar5 = xmlHashAdd2(pxVar13,pxVar9,pxVar10,(void *)(ulong)uVar6);
            if (-1 < iVar5) goto LAB_001384a7;
          }
          xmlCtxtErrMemory(ctxt);
        }
LAB_001384a7:
        if (defaultValue != (xmlChar *)0x0) {
          (*xmlFree)(defaultValue);
        }
        pxVar11 = ctxt->input;
        if (((pxVar11->flags & 0x40) == 0) && ((long)pxVar11->end - (long)pxVar11->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
      }
      if (local_34 != pxVar11->id) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "Attribute list declaration doesn\'t start and stop in the same entity\n");
      }
      xmlNextChar(ctxt);
    }
  }
  return;
LAB_0013809f:
  while (xVar18 == ' ') {
    pxVar1 = pxVar17 + 1;
    pxVar17 = pxVar17 + 1;
    xVar18 = *pxVar1;
  }
  if (xVar18 != '\0') {
    xVar18 = ' ';
LAB_001380ad:
    *pxVar14 = xVar18;
    xVar18 = *pxVar17;
    pxVar14 = pxVar14 + 1;
  }
  goto LAB_001380b4;
}

Assistant:

void
xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *elemName;
    const xmlChar *attrName;
    xmlEnumerationPtr tree;

    if ((CUR != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);

    if (CMP7(CUR_PTR, 'A', 'T', 'T', 'L', 'I', 'S', 'T')) {
	int inputid = ctxt->input->id;

	SKIP(7);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		                 "Space required after '<!ATTLIST'\n");
	}
        elemName = xmlParseName(ctxt);
	if (elemName == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "ATTLIST: no name for Element\n");
	    return;
	}
	SKIP_BLANKS_PE;
	GROW;
	while ((RAW != '>') && (PARSER_STOPPED(ctxt) == 0)) {
	    int type;
	    int def;
	    xmlChar *defaultValue = NULL;

	    GROW;
            tree = NULL;
	    attrName = xmlParseName(ctxt);
	    if (attrName == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			       "ATTLIST: no name for Attribute\n");
		break;
	    }
	    GROW;
	    if (SKIP_BLANKS_PE == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		        "Space required after the attribute name\n");
		break;
	    }

	    type = xmlParseAttributeType(ctxt, &tree);
	    if (type <= 0) {
	        break;
	    }

	    GROW;
	    if (SKIP_BLANKS_PE == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			       "Space required after the attribute type\n");
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
		break;
	    }

	    def = xmlParseDefaultDecl(ctxt, &defaultValue);
	    if (def <= 0) {
                if (defaultValue != NULL)
		    xmlFree(defaultValue);
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
	        break;
	    }
	    if ((type != XML_ATTRIBUTE_CDATA) && (defaultValue != NULL))
	        xmlAttrNormalizeSpace(defaultValue, defaultValue);

	    GROW;
            if (RAW != '>') {
		if (SKIP_BLANKS_PE == 0) {
		    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			"Space required after the attribute default value\n");
		    if (defaultValue != NULL)
			xmlFree(defaultValue);
		    if (tree != NULL)
			xmlFreeEnumeration(tree);
		    break;
		}
	    }
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->attributeDecl != NULL))
		ctxt->sax->attributeDecl(ctxt->userData, elemName, attrName,
	                        type, def, defaultValue, tree);
	    else if (tree != NULL)
		xmlFreeEnumeration(tree);

	    if ((ctxt->sax2) && (defaultValue != NULL) &&
	        (def != XML_ATTRIBUTE_IMPLIED) &&
		(def != XML_ATTRIBUTE_REQUIRED)) {
		xmlAddDefAttrs(ctxt, elemName, attrName, defaultValue);
	    }
	    if (ctxt->sax2) {
		xmlAddSpecialAttr(ctxt, elemName, attrName, type);
	    }
	    if (defaultValue != NULL)
	        xmlFree(defaultValue);
	    GROW;
	}
	if (RAW == '>') {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Attribute list declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	}
    }
}